

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O1

Vec_Ptr_t * Fra_CollectSuper(Aig_Obj_t *pObj,int fUseMuxes)

{
  Vec_Ptr_t *vSuper;
  void **ppvVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0xc3,"Vec_Ptr_t *Fra_CollectSuper(Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
    vSuper = (Vec_Ptr_t *)malloc(0x10);
    vSuper->nCap = 8;
    vSuper->nSize = 0;
    ppvVar1 = (void **)malloc(0x40);
    vSuper->pArray = ppvVar1;
    Fra_CollectSuper_rec(pObj,vSuper,1,fUseMuxes);
    return vSuper;
  }
  __assert_fail("!Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                ,0xc4,"Vec_Ptr_t *Fra_CollectSuper(Aig_Obj_t *, int)");
}

Assistant:

Vec_Ptr_t * Fra_CollectSuper( Aig_Obj_t * pObj, int fUseMuxes )
{
    Vec_Ptr_t * vSuper;
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCi(pObj) );
    vSuper = Vec_PtrAlloc( 4 );
    Fra_CollectSuper_rec( pObj, vSuper, 1, fUseMuxes );
    return vSuper;
}